

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

void cf_chacha20_init_custom
               (cf_chacha20_ctx *ctx,uint8_t *key,size_t nkey,uint8_t *nonce,size_t ncounter)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (ncounter != 0) {
    if (nkey == 0x20) {
      uVar1 = *(undefined8 *)(key + 8);
      *(undefined8 *)ctx->key0 = *(undefined8 *)key;
      *(undefined8 *)(ctx->key0 + 8) = uVar1;
      uVar1 = *(undefined8 *)(key + 0x18);
      *(undefined8 *)ctx->key1 = *(undefined8 *)(key + 0x10);
      *(undefined8 *)(ctx->key1 + 8) = uVar1;
      pcVar2 = "expand 32-byte k";
    }
    else {
      if (nkey != 0x10) goto LAB_0010884a;
      uVar1 = *(undefined8 *)(key + 8);
      *(undefined8 *)ctx->key0 = *(undefined8 *)key;
      *(undefined8 *)(ctx->key0 + 8) = uVar1;
      uVar1 = *(undefined8 *)(key + 8);
      *(undefined8 *)ctx->key1 = *(undefined8 *)key;
      *(undefined8 *)(ctx->key1 + 8) = uVar1;
      pcVar2 = "expand 16-byte k";
    }
    ctx->constant = (uint8_t *)pcVar2;
    uVar1 = *(undefined8 *)(nonce + 8);
    *(undefined8 *)ctx->nonce = *(undefined8 *)nonce;
    *(undefined8 *)(ctx->nonce + 8) = uVar1;
    ctx->nblock = 0;
    ctx->ncounter = ncounter;
    return;
  }
LAB_0010884a:
  abort();
}

Assistant:

void cf_chacha20_init_custom(cf_chacha20_ctx *ctx, const uint8_t *key, size_t nkey,
                             const uint8_t nonce[16], size_t ncounter)
{
  assert(ncounter > 0);
  set_key(ctx, key, nkey);
  memcpy(ctx->nonce, nonce, sizeof ctx->nonce);
  ctx->nblock = 0;
  ctx->ncounter = ncounter;
}